

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_set.h
# Opt level: O0

ostream * merlin::operator<<(ostream *os,variable_set *v)

{
  size_t sVar1;
  const_reference pvVar2;
  ostream *this;
  ulong local_20;
  size_t i;
  variable_set *v_local;
  ostream *os_local;
  
  std::operator<<(os,"[");
  sVar1 = variable_set::nvar(v);
  if (sVar1 != 0) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](&v->m_v,0);
    std::ostream::operator<<(os,*pvVar2);
    for (local_20 = 1; sVar1 = variable_set::nvar(v), local_20 < sVar1; local_20 = local_20 + 1) {
      this = std::operator<<(os,",");
      pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (&v->m_v,local_20);
      std::ostream::operator<<(this,*pvVar2);
    }
  }
  std::operator<<(os,"]");
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream &os, variable_set const& v) {
		os << "[";
		if (v.nvar() != 0) {
			os << v.m_v[0];
			for (size_t i = 1; i < v.nvar(); i++)
				os << "," << v.m_v[i];
		}
		os << "]";
		return os;
	}